

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O1

void __thiscall Memory::LargeHeapBlock::PageHeapLockPages(LargeHeapBlock *this)

{
  byte *pbVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  DWORD local_1c [2];
  DWORD oldProtect;
  
  if (this->pageHeapData->isLockedWithPageHeap == false) {
    if (this->allocCount != 0) {
      if (this->allocCount != 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                           ,0x94d,"(this->allocCount == 1)","this->allocCount == 1");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      VerifyPageHeapPattern(this);
    }
    pbVar1 = (byte *)(this->pageHeapData->objectAddress + -6);
    *pbVar1 = *pbVar1 | 4;
    BVar4 = VirtualProtect(this->pageHeapData->objectPageAddr,this->pageCount << 0xc,2,local_1c);
    if (BVar4 == 0) {
      pbVar1 = (byte *)(this->pageHeapData->objectAddress + -6);
      *pbVar1 = *pbVar1 & 0xfb;
    }
    else {
      this->pageHeapData->isLockedWithPageHeap = true;
    }
  }
  return;
}

Assistant:

void 
LargeHeapBlock::PageHeapLockPages()
{
    if (!pageHeapData->isLockedWithPageHeap)
    {
        if (this->allocCount > 0) // in case OOM while adding heapblock to heapBlockMap, we release page before setting the pattern
        {
            Assert(this->allocCount == 1); // one object per heapblock in pageheap
            VerifyPageHeapPattern();
        }

        DWORD oldProtect;
        GetHeaderFromAddress(pageHeapData->objectAddress)->isObjectPageLocked = true;
        if (VirtualProtect(pageHeapData->objectPageAddr, this->pageCount * AutoSystemInfo::PageSize, PAGE_READONLY, &oldProtect))
        {
            pageHeapData->isLockedWithPageHeap = true;
        }
        else
        {
            GetHeaderFromAddress(pageHeapData->objectAddress)->isObjectPageLocked = false;
        }
    }
}